

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int load_aux(lua_State *L,int status)

{
  StkId pTVar1;
  
  if (status != 0) {
    pTVar1 = L->top;
    pTVar1->tt = 0;
    L->top = pTVar1 + 1;
    lua_insert(L,-2);
    return 2;
  }
  return 1;
}

Assistant:

static int load_aux(lua_State*L,int status){
if(status==0)
return 1;
else{
lua_pushnil(L);
lua_insert(L,-2);
return 2;
}
}